

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O0

void update_spki(spki_table *s,spki_record record,_Bool added)

{
  long lVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  int local_20;
  int size;
  int i;
  _Bool added_local;
  spki_table *s_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0x2d;
  if (added) {
    uVar2 = 0x2b;
  }
  printf("%c ASN: %u\n",uVar2,(ulong)record.asn);
  printf("SKI:  ");
  for (local_20 = 0; local_20 < 0x14; local_20 = local_20 + 1) {
    printf("%02x",(ulong)record.ski[local_20]);
    if (local_20 < 0x13) {
      printf(":");
    }
  }
  printf("\n  ");
  printf("SPKI: ");
  for (local_20 = 0; local_20 < 0x5b; local_20 = local_20 + 1) {
    if ((local_20 % 0x28 == 0) && (local_20 != 0)) {
      printf("\n\t");
    }
    printf("%02x",(ulong)record.spki[local_20]);
    if (local_20 < 0x5a) {
      printf(":");
    }
  }
  printf("\n");
  if ((record.asn == 1) && (added)) {
    __assert_fail("!added",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x250,
                  "void update_spki(struct spki_table *, const struct spki_record, const _Bool)");
  }
  if (record.asn == 2) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x252,
                  "void update_spki(struct spki_table *, const struct spki_record, const _Bool)");
  }
  if ((record.asn == 3) && (!added)) {
    __assert_fail("added",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x254,
                  "void update_spki(struct spki_table *, const struct spki_record, const _Bool)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void update_spki(struct spki_table *s __attribute__((unused)), const struct spki_record record, const bool added)
{
	printf("%c ASN: %u\n", (added ? '+' : '-'), record.asn);

	int i;
	int size = sizeof(record.ski);

	printf("SKI:  ");
	for (i = 0; i < size; i++) {
		printf("%02x", record.ski[i]);
		if (i < size - 1)
			printf(":");
	}
	printf("\n  ");

	i = 0;
	size = sizeof(record.spki);
	printf("SPKI: ");
	for (i = 0; i < size; i++) {
		if ((i % 40 == 0) && (i != 0))
			printf("\n	");

		printf("%02x", record.spki[i]);
		if (i < size - 1)
			printf(":");
	}
	printf("\n");

	if (record.asn == 1)
		assert(!added);
	if (record.asn == 2)
		assert(false);
	if (record.asn == 3)
		assert(added);
}